

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O2

void __thiscall SNMPTrap::SNMPTrap(SNMPTrap *this,char *community,SNMP_VERSION version)

{
  OIDType *pOVar1;
  allocator local_49;
  string local_48;
  
  SNMPPacket::SNMPPacket(&this->super_SNMPPacket);
  (this->super_SNMPPacket)._vptr_SNMPPacket = (_func_int **)&PTR__SNMPTrap_0019b968;
  IPAddress::IPAddress(&this->agentIP);
  this->trapOID = (OIDType *)0x0;
  this->uptimeCallback = (TimestampCallback *)0x0;
  this->genericTrap = 6;
  this->specificTrap = 1;
  this->trapUDPport = 0xa2;
  this->inform = false;
  this->_udp = (UDP *)0x0;
  *(list<ValueCallback_*,_std::allocator<ValueCallback_*>_> **)&this->field_0x110 = &this->callbacks
  ;
  *(list<ValueCallback_*,_std::allocator<ValueCallback_*>_> **)&this->callbacks = &this->callbacks;
  *(undefined8 *)&this->field_0x118 = 0;
  pOVar1 = (OIDType *)operator_new(0x50);
  std::__cxx11::string::string((string *)&local_48,".1.3.6.1.2.1.1.3.0",&local_49);
  OIDType::OIDType(pOVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->timestampOID = pOVar1;
  pOVar1 = (OIDType *)operator_new(0x50);
  std::__cxx11::string::string((string *)&local_48,".1.3.6.1.2.1.1.2.0",&local_49);
  OIDType::OIDType(pOVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->snmpTrapOID = pOVar1;
  SNMPPacket::setVersion(&this->super_SNMPPacket,version);
  SNMPPacket::setPDUType(&this->super_SNMPPacket,Trapv2PDU);
  std::__cxx11::string::string((string *)&local_48,community,&local_49);
  SNMPPacket::setCommunityString(&this->super_SNMPPacket,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

SNMPTrap(const char* community, SNMP_VERSION version){
        this->setVersion(version);
        // Version two will use the SNMPPacket builder which uses the member pduType
        // Version one will use special builder with hardcoded PDU Type
        this->setPDUType(Trapv2PDU);
        this->setCommunityString(community);
    }